

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O2

void __thiscall
wasm::UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::
UniqueNonrepeatingDeferredQueue
          (UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *this
          )

{
  UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::UniqueDeferredQueue
            (&this->super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>);
  (this->processed)._M_h._M_buckets = &(this->processed)._M_h._M_single_bucket;
  (this->processed)._M_h._M_bucket_count = 1;
  (this->processed)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->processed)._M_h._M_element_count = 0;
  (this->processed)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->processed)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->processed)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

void push(T item) {
    if (!processed.count(item)) {
      UniqueDeferredQueue<T>::push(item);
    }
  }